

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDescriptorPoolTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::outOfPoolMemoryTest(TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  bool bVar2;
  VkResult value;
  VkDescriptorType value_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  char *pcVar4;
  size_t sVar5;
  long *plVar6;
  pointer pbVar7;
  long *plVar8;
  TestLog *pTVar9;
  long *plVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  VkDescriptorPoolSize descriptorPoolSize;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  rawSetLayouts;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  descriptorSetLayoutBindings;
  vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
  rawDescriptorSets;
  VkDescriptorSetLayoutBinding descriptorSetLayoutBinding;
  VkDescriptorSetLayoutCreateInfo descriptorSetLayoutInfo;
  VkDescriptorPoolCreateInfo descriptorPoolCreateInfo;
  VkDescriptorSetAllocateInfo descriptorSetAllocateInfo;
  FailureCase failureCases [5];
  allocator<char> local_489;
  TestStatus *local_488;
  int local_47c;
  Context *local_478;
  pointer local_470;
  string *local_468;
  VkDevice local_460;
  DeviceInterface *local_458;
  long *local_450;
  long local_448;
  long local_440;
  long lStack_438;
  ulong local_430;
  VkDescriptorPoolSize local_428;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_> local_420
  ;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  local_408;
  ulong local_3f0;
  pointer local_3e8;
  pointer local_3e0;
  vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_> local_3d8
  ;
  value_type local_3c0;
  long *local_3a8 [2];
  long local_398 [2];
  value_type local_388;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_380;
  VkDescriptorPool local_368;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_360;
  VkDescriptorSetLayoutCreateInfo local_340;
  VkDescriptorPoolCreateInfo local_320;
  undefined1 local_2f8 [16];
  TestLog local_2e8 [13];
  ios_base local_280 [272];
  undefined4 local_170 [2];
  undefined8 local_168;
  TestLog *local_160;
  undefined4 local_158;
  pointer local_150;
  deUint32 local_148 [2];
  uint auStack_140 [2];
  deUint32 local_138 [2];
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_488 = __return_storage_ptr__;
  local_458 = Context::getDeviceInterface(context);
  local_460 = Context::getDevice(context);
  pvVar3 = Context::getDeviceExtensions_abi_cxx11_(context);
  pbVar7 = (pvVar3->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_478 = context;
  pvVar3 = Context::getDeviceExtensions_abi_cxx11_(context);
  local_3e0 = (pvVar3->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_3e8 = (pointer)std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                                 (pbVar7,local_3e0,"VK_KHR_maintenance1");
  local_148[0] = 4;
  local_148[1] = 2;
  auStack_140[0] = 1;
  auStack_140[1] = 1;
  local_138[0] = 3;
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Out of descriptor sets","");
  local_110 = 3;
  uStack_10c = 4;
  uStack_108 = 1;
  uStack_104 = 1;
  local_100 = 4;
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,"Out of descriptors (due to the number of sets)","");
  local_d8 = 2;
  uStack_d4 = 1;
  uStack_d0 = 3;
  uStack_cc = 1;
  local_c8 = 1;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"Out of descriptors (due to the number of bindings)","");
  local_a0 = 3;
  uStack_9c = 2;
  uStack_98 = 1;
  uStack_94 = 2;
  local_90 = 2;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"Out of descriptors (due to descriptor array size)","");
  local_68 = 5;
  uStack_64 = 1;
  uStack_60 = 2;
  uStack_5c = 3;
  local_58 = 1;
  plVar10 = local_40;
  local_50[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Out of descriptors (due to descriptor array size in all bindings)",
             "");
  local_2f8._0_8_ = local_478->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_2f8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Creating a descriptor pool with insufficient resources. Descriptor set allocation is likely to fail."
             ,100);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_280);
  poVar1 = (ostringstream *)(local_2f8 + 8);
  local_468 = (string *)&local_488->m_description;
  local_470 = (pointer)&(local_488->m_description).field_2;
  uVar11 = 0;
  local_430 = 0;
  local_47c = 0;
  do {
    local_2f8._0_8_ = local_478->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Checking: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(&local_130)[uVar11 * 7],(&local_128)[uVar11 * 7]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_3f0 = uVar11;
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_280);
    bVar13 = false;
    value_00 = VK_DESCRIPTOR_TYPE_SAMPLER;
    do {
      local_2f8._0_8_ = local_478->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"- ",2);
      pcVar4 = ::vk::getDescriptorTypeName(value_00);
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)((DeviceInterface *)(local_2f8._8_8_ + -0x18))->_vptr_DeviceInterface +
                        (int)poVar1);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar4,sVar5);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_280);
      local_428.descriptorCount = local_148[uVar11 * 0xe];
      local_320.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
      local_320.pNext = (void *)0x0;
      local_320.flags = 0;
      local_320.maxSets = local_148[uVar11 * 0xe + 1];
      local_320.poolSizeCount = 1;
      local_320.pPoolSizes = &local_428;
      local_428.type = value_00;
      ::vk::createDescriptorPool
                ((Move<vk::Handle<(vk::HandleType)21>_> *)local_2f8,local_458,local_460,&local_320,
                 (VkAllocationCallbacks *)0x0);
      DStack_360.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(local_2e8[1].m_log._4_4_,local_2e8[1].m_log._0_4_);
      DStack_360.m_device = (VkDevice)local_2e8[0].m_log;
      local_368.m_internal = local_2f8._0_8_;
      DStack_360.m_deviceIface = (DeviceInterface *)local_2f8._8_8_;
      local_3c0.binding = 0;
      local_3c0.descriptorCount = local_138[uVar11 * 0xe + -1];
      local_3c0.stageFlags = 0x7fffffff;
      local_3c0.pImmutableSamplers = (VkSampler *)0x0;
      local_3c0.descriptorType = value_00;
      std::
      vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
      vector(&local_408,(ulong)auStack_140[uVar11 * 0xe],&local_3c0,(allocator_type *)local_2f8);
      local_340.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
      local_340.pNext = (void *)0x0;
      local_340.flags = 0;
      local_340.bindingCount =
           (int)((ulong)((long)local_408.
                               super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_408.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      local_340.pBindings =
           local_408.
           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
      ::vk::createDescriptorSetLayout
                ((Move<vk::Handle<(vk::HandleType)19>_> *)local_2f8,local_458,local_460,&local_340,
                 (VkAllocationCallbacks *)0x0);
      DStack_380.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(local_2e8[1].m_log._4_4_,local_2e8[1].m_log._0_4_);
      DStack_380.m_device = (VkDevice)local_2e8[0].m_log;
      local_388.m_internal = local_2f8._0_8_;
      DStack_380.m_deviceIface = (DeviceInterface *)local_2f8._8_8_;
      std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
      ::vector(&local_420,(ulong)local_138[uVar11 * 0xe],&local_388,(allocator_type *)local_2f8);
      local_2f8._0_8_ = (TestLog *)0x0;
      std::vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
      ::vector(&local_3d8,(ulong)local_138[uVar11 * 0xe],(value_type *)local_2f8,
               (allocator_type *)local_170);
      local_170[0] = 0x22;
      local_168 = 0;
      local_160 = (TestLog *)local_368.m_internal;
      local_158 = (undefined4)
                  ((ulong)((long)local_420.
                                 super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_420.
                                super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_150 = local_420.
                  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pbVar7 = (pointer)local_3d8.
                        super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      value = (*local_458->_vptr_DeviceInterface[0x3c])
                        (local_458,local_460,(allocator_type *)local_170,
                         local_3d8.
                         super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (value == VK_SUCCESS) {
        local_2f8._0_8_ = local_478->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_2f8 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_2f8 + 8),"  Allocation was successful anyway",0x22);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_2f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_2f8 + 8));
        std::ios_base::~ios_base(local_280);
        bVar2 = true;
      }
      else {
        local_47c = local_47c + 1;
        bVar2 = true;
        pbVar7 = local_3e8;
        if ((local_3e8 != local_3e0) && (value != VK_ERROR_OUT_OF_POOL_MEMORY_KHR)) {
          pcVar4 = ::vk::getResultName(value);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_3a8,pcVar4,&local_489);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)local_3a8,0,(char *)0x0,0xad8f1a);
          local_450 = &local_440;
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_440 = *plVar8;
            lStack_438 = plVar6[3];
          }
          else {
            local_440 = *plVar8;
            local_450 = (long *)*plVar6;
          }
          local_448 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_450);
          local_2f8._0_8_ = local_2e8;
          pTVar9 = (TestLog *)(plVar6 + 2);
          if ((TestLog *)*plVar6 == pTVar9) {
            local_2e8[0].m_log = pTVar9->m_log;
            local_2e8[1].m_log._0_4_ = *(undefined4 *)(plVar6 + 3);
            local_2e8[1].m_log._4_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
          }
          else {
            local_2e8[0].m_log = pTVar9->m_log;
            local_2f8._0_8_ = (TestLog *)*plVar6;
          }
          local_2f8._8_8_ = plVar6[1];
          *plVar6 = (long)pTVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          local_488->m_code = QP_TEST_RESULT_FAIL;
          (local_488->m_description)._M_dataplus._M_p = (pointer)local_470;
          pbVar7 = local_470;
          std::__cxx11::string::_M_construct<char*>
                    (local_468,local_2f8._0_8_,
                     (long)(qpTestLog **)local_2f8._0_8_ +
                     (long)&((DeviceInterface *)local_2f8._8_8_)->_vptr_DeviceInterface);
          if ((TestLog *)local_2f8._0_8_ != local_2e8) {
            operator_delete((void *)local_2f8._0_8_,(ulong)((long)&(local_2e8[0].m_log)->flags + 1))
            ;
          }
          if (local_450 != &local_440) {
            operator_delete(local_450,local_440 + 1);
          }
          if (local_3a8[0] != local_398) {
            operator_delete(local_3a8[0],local_398[0] + 1);
          }
          bVar2 = false;
        }
      }
      if ((pointer)local_3d8.
                   super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                   ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3d8.
                        super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_3d8.
                              super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3d8.
                              super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_420.
          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_420.
                        super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_420.
                              super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_420.
                              super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_388.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  (&DStack_380,(VkDescriptorSetLayout)local_388.m_internal);
      }
      if (local_408.
          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_408.
                        super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_408.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_408.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_368.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  (&DStack_360,local_368);
      }
      if (!bVar2) break;
      bVar13 = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC < value_00;
      value_00 = value_00 + VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
    } while (value_00 != VK_DESCRIPTOR_TYPE_LAST);
    if (!bVar13) break;
    uVar11 = local_3f0 + 1;
    local_430 = CONCAT71((int7)((ulong)pbVar7 >> 8),3 < local_3f0);
  } while (uVar11 != 5);
  if ((local_430 & 1) != 0) {
    if (local_47c == 0) {
      local_2f8._0_8_ = local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"Not validated","");
      local_488->m_code = QP_TEST_RESULT_PASS;
      (local_488->m_description)._M_dataplus._M_p = (pointer)local_470;
      std::__cxx11::string::_M_construct<char*>
                (local_468,local_2f8._0_8_,
                 (long)(qpTestLog **)local_2f8._0_8_ + (long)(_func_int ***)local_2f8._8_8_);
    }
    else {
      local_2f8._0_8_ = local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"Pass","");
      local_488->m_code = QP_TEST_RESULT_PASS;
      (local_488->m_description)._M_dataplus._M_p = (pointer)local_470;
      std::__cxx11::string::_M_construct<char*>
                (local_468,local_2f8._0_8_,
                 (long)(qpTestLog **)local_2f8._0_8_ + (long)(_func_int ***)local_2f8._8_8_);
    }
    if ((TestLog *)local_2f8._0_8_ != local_2e8) {
      operator_delete((void *)local_2f8._0_8_,(ulong)((long)&(local_2e8[0].m_log)->flags + 1));
    }
  }
  lVar12 = -0x118;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -7;
    lVar12 = lVar12 + 0x38;
  } while (lVar12 != 0);
  return local_488;
}

Assistant:

tcu::TestStatus outOfPoolMemoryTest (Context& context)
{
	const DeviceInterface&	vkd							= context.getDeviceInterface();
	const VkDevice			device						= context.getDevice();
	const bool				expectOutOfPoolMemoryError	= de::contains(context.getDeviceExtensions().begin(), context.getDeviceExtensions().end(), "VK_KHR_maintenance1");
	deUint32				numErrorsReturned			= 0;

	const struct FailureCase
	{
		deUint32	poolDescriptorCount;		//!< total number of descriptors (of a given type) in the descriptor pool
		deUint32	poolMaxSets;				//!< max number of descriptor sets that can be allocated from the pool
		deUint32	bindingCount;				//!< number of bindings per descriptor set layout
		deUint32	bindingDescriptorCount;		//!< number of descriptors in a binding (array size) (in all bindings)
		deUint32	descriptorSetCount;			//!< number of descriptor sets to allocate
		string		description;				//!< the log message for this failure condition
	} failureCases[] =
	{
		//	pool			pool		binding		binding		alloc set
		//	descr. count	max sets	count		array size	count
		{	4u,				2u,			1u,			1u,			3u,		"Out of descriptor sets",											},
		{	3u,				4u,			1u,			1u,			4u,		"Out of descriptors (due to the number of sets)",					},
		{	2u,				1u,			3u,			1u,			1u,		"Out of descriptors (due to the number of bindings)",				},
		{	3u,				2u,			1u,			2u,			2u,		"Out of descriptors (due to descriptor array size)",				},
		{	5u,				1u,			2u,			3u,			1u,		"Out of descriptors (due to descriptor array size in all bindings)",},
	};

	context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "Creating a descriptor pool with insufficient resources. Descriptor set allocation is likely to fail."
		<< tcu::TestLog::EndMessage;

	for (deUint32 failureCaseNdx = 0u; failureCaseNdx < DE_LENGTH_OF_ARRAY(failureCases); ++failureCaseNdx)
	{
		const FailureCase& params = failureCases[failureCaseNdx];
		context.getTestContext().getLog() << tcu::TestLog::Message << "Checking: " << params.description << tcu::TestLog::EndMessage;

		for (VkDescriptorType	descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
								descriptorType < VK_DESCRIPTOR_TYPE_LAST;
								descriptorType = static_cast<VkDescriptorType>(descriptorType + 1))
		{
			context.getTestContext().getLog() << tcu::TestLog::Message << "- " << getDescriptorTypeName(descriptorType) << tcu::TestLog::EndMessage;

			const VkDescriptorPoolSize					descriptorPoolSize =
			{
				descriptorType,												// type
				params.poolDescriptorCount,									// descriptorCount
			};

			const VkDescriptorPoolCreateInfo			descriptorPoolCreateInfo =
			{
				VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,				// VkStructureType                sType;
				DE_NULL,													// const void*                    pNext;
				(VkDescriptorPoolCreateFlags)0,								// VkDescriptorPoolCreateFlags    flags;
				params.poolMaxSets,											// uint32_t                       maxSets;
				1u,															// uint32_t                       poolSizeCount;
				&descriptorPoolSize,										// const VkDescriptorPoolSize*    pPoolSizes;
			};

			const Unique<VkDescriptorPool>				descriptorPool(createDescriptorPool(vkd, device, &descriptorPoolCreateInfo));

			const VkDescriptorSetLayoutBinding			descriptorSetLayoutBinding =
			{
				0u,															// uint32_t              binding;
				descriptorType,												// VkDescriptorType      descriptorType;
				params.bindingDescriptorCount,								// uint32_t              descriptorCount;
				VK_SHADER_STAGE_ALL,										// VkShaderStageFlags    stageFlags;
				DE_NULL,													// const VkSampler*      pImmutableSamplers;
			};

			const vector<VkDescriptorSetLayoutBinding>	descriptorSetLayoutBindings (params.bindingCount, descriptorSetLayoutBinding);
			const VkDescriptorSetLayoutCreateInfo		descriptorSetLayoutInfo =
			{
				VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,		// VkStructureType                        sType;
				DE_NULL,													// const void*                            pNext;
				(VkDescriptorSetLayoutCreateFlags)0,						// VkDescriptorSetLayoutCreateFlags       flags;
				static_cast<deUint32>(descriptorSetLayoutBindings.size()),	// uint32_t                               bindingCount;
				&descriptorSetLayoutBindings[0],							// const VkDescriptorSetLayoutBinding*    pBindings;
			};

			const Unique<VkDescriptorSetLayout>			descriptorSetLayout	(createDescriptorSetLayout(vkd, device, &descriptorSetLayoutInfo));
			const vector<VkDescriptorSetLayout>			rawSetLayouts		(params.descriptorSetCount, *descriptorSetLayout);
			vector<VkDescriptorSet>						rawDescriptorSets	(params.descriptorSetCount, DE_NULL);

			const VkDescriptorSetAllocateInfo			descriptorSetAllocateInfo =
			{
				VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,				// VkStructureType                 sType;
				DE_NULL,													// const void*                     pNext;
				*descriptorPool,											// VkDescriptorPool                descriptorPool;
				static_cast<deUint32>(rawSetLayouts.size()),				// uint32_t                        descriptorSetCount;
				&rawSetLayouts[0],											// const VkDescriptorSetLayout*    pSetLayouts;
			};

			const VkResult result = vkd.allocateDescriptorSets(device, &descriptorSetAllocateInfo, &rawDescriptorSets[0]);

			if (result != VK_SUCCESS)
			{
				++numErrorsReturned;

				if (expectOutOfPoolMemoryError && result != VK_ERROR_OUT_OF_POOL_MEMORY_KHR)
					return tcu::TestStatus::fail("Expected VK_ERROR_OUT_OF_POOL_MEMORY_KHR but got " + string(getResultName(result)) + " instead");
			}
			else
				context.getTestContext().getLog() << tcu::TestLog::Message << "  Allocation was successful anyway" << tcu::TestLog::EndMessage;
		}
	}

	if (numErrorsReturned == 0u)
		return tcu::TestStatus::pass("Not validated");
	else
		return tcu::TestStatus::pass("Pass");
}